

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O0

int Seg_ManCountIntLevels(Seg_Man_t *p,int iStartVar)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  int local_40;
  int local_24;
  int nVars;
  int iLut;
  Gia_Obj_t *pObj;
  int iStartVar_local;
  Seg_Man_t *p_local;
  
  pVVar1 = p->vFirsts;
  iVar2 = Gia_ManObjNum(p->pGia);
  Vec_IntFill(pVVar1,iVar2,-1);
  pVVar1 = p->vNvars;
  iVar2 = Gia_ManObjNum(p->pGia);
  Vec_IntFill(pVVar1,iVar2,0);
  if (p->pLevels != (int *)0x0) {
    free(p->pLevels);
    p->pLevels = (int *)0x0;
  }
  if (p->pGia->pManTime == (void *)0x0) {
    iVar2 = Gia_ManLutLevel(p->pGia,&p->pLevels);
    p->DelayMax = iVar2;
  }
  else {
    iVar2 = Gia_ManLutLevelWithBoxes(p->pGia);
    p->DelayMax = iVar2;
    piVar3 = Vec_IntReleaseArray(p->pGia->vLevels);
    p->pLevels = piVar3;
    Vec_IntFreeP(&p->pGia->vLevels);
  }
  local_24 = 1;
  pObj._4_4_ = iStartVar;
  while( true ) {
    bVar4 = false;
    if (local_24 < p->pGia->nObjs) {
      _nVars = Gia_ManObj(p->pGia,local_24);
      bVar4 = _nVars != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar2 = Gia_ObjIsCo(_nVars);
    if ((iVar2 == 0) &&
       ((iVar2 = Gia_ObjIsAnd(_nVars), iVar2 == 0 ||
        (iVar2 = Gia_ObjIsLut(p->pGia,local_24), iVar2 != 0)))) {
      iVar2 = Gia_ObjIsCi(_nVars);
      if ((iVar2 == 0) && (iVar2 = Gia_ObjIsLut(p->pGia,local_24), iVar2 == 0)) {
        __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsLut(p->pGia, iLut)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                      ,0x86,"int Seg_ManCountIntLevels(Seg_Man_t *, int)");
      }
      Vec_IntWriteEntry(p->vFirsts,local_24,pObj._4_4_);
      if (p->pLevels[local_24] < 2) {
        local_40 = 0;
      }
      else {
        local_40 = p->pLevels[local_24];
      }
      Vec_IntWriteEntry(p->vNvars,local_24,local_40);
      pObj._4_4_ = local_40 + pObj._4_4_;
    }
    local_24 = local_24 + 1;
  }
  return pObj._4_4_;
}

Assistant:

int Seg_ManCountIntLevels( Seg_Man_t * p, int iStartVar )
{
    Gia_Obj_t * pObj;
    int iLut, nVars;
    Vec_IntFill( p->vFirsts, Gia_ManObjNum(p->pGia), -1 );
    Vec_IntFill( p->vNvars,  Gia_ManObjNum(p->pGia), 0 );
    ABC_FREE( p->pLevels );
    if ( p->pGia->pManTime )
    {
        p->DelayMax = Gia_ManLutLevelWithBoxes( p->pGia );
        p->pLevels = Vec_IntReleaseArray( p->pGia->vLevels );
        Vec_IntFreeP( &p->pGia->vLevels );
    }
    else
        p->DelayMax = Gia_ManLutLevel( p->pGia, &p->pLevels );
    Gia_ManForEachObj1( p->pGia, pObj, iLut )
    {
        if ( Gia_ObjIsCo(pObj) )
            continue;
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsLut(p->pGia, iLut) )
            continue;
        assert( Gia_ObjIsCi(pObj) || Gia_ObjIsLut(p->pGia, iLut) );
        Vec_IntWriteEntry( p->vFirsts, iLut, iStartVar );
        //assert( p->pLevels[iLut] > 0 );
        nVars = p->pLevels[iLut] < 2 ? 0 : p->pLevels[iLut];
        Vec_IntWriteEntry( p->vNvars,  iLut, nVars );
        iStartVar += nVars;
    }
    return iStartVar;
}